

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::LabelTests_SAMTBackwardApplyComma_Test::TestBody
          (LabelTests_SAMTBackwardApplyComma_Test *this)

{
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  AssertHelper local_170;
  Message local_168;
  undefined2 local_160;
  undefined2 uStack_15e;
  undefined2 uStack_15c;
  undefined2 uStack_15a;
  string_view local_158;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_3;
  undefined1 local_120 [8];
  SAMTLabeler sl;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_2;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  Span root;
  Message local_70 [3];
  size_type local_58;
  int local_4c;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  undefined1 local_28 [8];
  Tree t;
  LabelTests_SAMTBackwardApplyComma_Test *this_local;
  
  t.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,
             "(ROOT (, foo) bar)");
  readTree((Tree *)local_28,stack0xffffffffffffffc8);
  local_4c = 2;
  local_58 = std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>::size
                       ((Tree *)local_28);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_48,"2","t.size()",&local_4c,&local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&root,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/label_test.cpp"
               ,0x7c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&root,local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&root);
    testing::Message::~Message(local_70);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    gtest_ar_1.message_.ptr_._0_2_ = 0;
    gtest_ar_1.message_.ptr_._2_2_ = 2;
    pvVar3 = std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>::front
                       ((vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_> *)local_28);
    testing::internal::EqHelper<false>::Compare<jhu::thrax::Span,jhu::thrax::Span>
              ((EqHelper<false> *)local_90,"root","t.front().span",(Span *)&gtest_ar_1.message_,
               &pvVar3->span);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar1) {
      testing::Message::Message(&local_98);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/label_test.cpp"
                 ,0x7e,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_98);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    gtest_ar_1.message_.ptr_._2_2_ = 1;
    pvVar3 = std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>::back
                       ((vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_> *)local_28);
    testing::internal::EqHelper<false>::Compare<jhu::thrax::Span,jhu::thrax::Span>
              ((EqHelper<false> *)local_b0,"root","t.back().span",(Span *)&gtest_ar_1.message_,
               &pvVar3->span);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
    if (!bVar1) {
      testing::Message::Message(&local_b8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)((long)&sl.key_.label.field_2 + 8),kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/label_test.cpp"
                 ,0x80,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)((long)&sl.key_.label.field_2 + 8),&local_b8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)((long)&sl.key_.label.field_2 + 8));
      testing::Message::~Message(&local_b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
    std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>::vector
              ((vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_> *)&gtest_ar_3.message_,
               (vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_> *)local_28);
    SAMTLabeler::SAMTLabeler((SAMTLabeler *)local_120,(Tree *)&gtest_ar_3.message_);
    std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>::~vector
              ((vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_> *)&gtest_ar_3.message_);
    local_160 = 0;
    uStack_15e = 0;
    uStack_15c = 1;
    uStack_15a = 2;
    local_158 = SAMTLabeler::operator()((SAMTLabeler *)local_120,(SpanPair)0x2000100000000);
    testing::internal::EqHelper<false>::
    Compare<char[11],std::basic_string_view<char,std::char_traits<char>>>
              ((EqHelper<false> *)local_148,"\"ROOT\\\\COMMA\"","sl(SpanPair{{}, { 1, 2 }})",
               (char (*) [11])"ROOT\\COMMA",&local_158);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
    if (!bVar1) {
      testing::Message::Message(&local_168);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
      testing::internal::AssertHelper::AssertHelper
                (&local_170,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/label_test.cpp"
                 ,0x82,pcVar2);
      testing::internal::AssertHelper::operator=(&local_170,&local_168);
      testing::internal::AssertHelper::~AssertHelper(&local_170);
      testing::Message::~Message(&local_168);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
    SAMTLabeler::~SAMTLabeler((SAMTLabeler *)local_120);
    gtest_ar_1.message_.ptr_._4_4_ = 0;
  }
  std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>::~vector
            ((vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_> *)local_28);
  return;
}

Assistant:

TEST(LabelTests, SAMTBackwardApplyComma) {
  auto t = readTree("(ROOT (, foo) bar)");
  ASSERT_EQ(2, t.size());
  Span root{0, 2};
  EXPECT_EQ(root, t.front().span);
  root.end = 1;
  EXPECT_EQ(root, t.back().span);
  SAMTLabeler sl(std::move(t));
  EXPECT_EQ("ROOT\\COMMA", sl(SpanPair{{}, { 1, 2 }}));
}